

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O2

void Abc_NodeFreeNames(Vec_Ptr_t *vNames)

{
  long lVar1;
  
  if (vNames != (Vec_Ptr_t *)0x0) {
    for (lVar1 = 0; lVar1 < vNames->nSize; lVar1 = lVar1 + 1) {
      if (vNames->pArray[lVar1] != (void *)0x0) {
        free(vNames->pArray[lVar1]);
        vNames->pArray[lVar1] = (void *)0x0;
      }
    }
    Vec_PtrFree(vNames);
    return;
  }
  return;
}

Assistant:

void Abc_NodeFreeNames( Vec_Ptr_t * vNames )
{
    int i;
    if ( vNames == NULL )
        return;
    for ( i = 0; i < vNames->nSize; i++ )
        ABC_FREE( vNames->pArray[i] );
    Vec_PtrFree( vNames );
}